

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

bool canBeNumericallyCompared(QMetaTypeInterface *iface1,QMetaTypeInterface *iface2)

{
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  QMetaTypeInterface *in_RSI;
  QMetaTypeInterface *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar4;
  undefined1 uVar5;
  bool isEnum2;
  bool isEnum1;
  bool isNumeric2;
  bool isNumeric1;
  undefined4 in_stack_ffffffffffffffc8;
  bool local_19;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI == (QMetaTypeInterface *)0x0) || (in_RSI == (QMetaTypeInterface *)0x0)) {
    local_19 = false;
  }
  else {
    uVar3 = QBasicAtomicInteger::operator_cast_to_int((QBasicAtomicInteger<int> *)0x4383e4);
    bVar1 = qIsNumericType(uVar3);
    uVar3 = QBasicAtomicInteger::operator_cast_to_int((QBasicAtomicInteger<int> *)0x4383ff);
    uVar2 = qIsNumericType(uVar3);
    if (((bVar1 & 1) == 0) || (!(bool)uVar2)) {
      uVar4 = (in_RDI->flags & 0x10) != 0;
      uVar5 = (in_RSI->flags & 0x10) != 0;
      if (((bool)uVar4) && ((bool)uVar5)) {
        QMetaType::QMetaType(&local_10,in_RDI);
        QMetaType::QMetaType(&local_18,in_RSI);
        local_19 = operator==((QMetaType *)in_RSI,
                              (QMetaType *)
                              CONCAT17(bVar1,CONCAT16(uVar2,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffffc8)))));
      }
      else if (((bool)uVar4) && ((bool)uVar2)) {
        local_19 = true;
      }
      else if (((bVar1 & 1) == 0) || (!(bool)uVar5)) {
        local_19 = false;
      }
      else {
        local_19 = true;
      }
    }
    else {
      local_19 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

static bool canBeNumericallyCompared(const QtPrivate::QMetaTypeInterface *iface1,
                                     const QtPrivate::QMetaTypeInterface *iface2)
{
    if (!iface1 || !iface2)
        return false;

    // We don't need QMetaType::id() here because the type Id is always stored
    // directly for all built-in types.
    bool isNumeric1 = qIsNumericType(iface1->typeId);
    bool isNumeric2 = qIsNumericType(iface2->typeId);

    // if they're both numeric (or QString), then they can be compared
    if (isNumeric1 && isNumeric2)
        return true;

    bool isEnum1 = iface1->flags & QMetaType::IsEnumeration;
    bool isEnum2 = iface2->flags & QMetaType::IsEnumeration;

    // if both are enums, we can only compare if they are the same enum
    // (the language does allow comparing two different enum types, but that's
    // usually considered poor coding and produces a warning)
    if (isEnum1 && isEnum2)
        return QMetaType(iface1) == QMetaType(iface2);

    // if one is an enum and the other is a numeric, we can compare too
    if (isEnum1 && isNumeric2)
        return true;
    if (isNumeric1 && isEnum2)
        return true;

    // we need at least one enum and one numeric...
    return false;
}